

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O2

int Gia_ManUnivTfo_rec(Gia_Man_t *p,int iObj,Vec_Int_t *vNodes,Vec_Int_t *vPos)

{
  Vec_Int_t *p_00;
  int iVar1;
  Gia_Obj_t *pGVar2;
  int iVar3;
  int iVar4;
  
  if (iObj < p->nTravIdsAlloc) {
    iVar4 = 0;
    if (p->pTravIds[iObj] != p->nTravIds) {
      p->pTravIds[iObj] = p->nTravIds;
      if (vNodes != (Vec_Int_t *)0x0) {
        pGVar2 = Gia_ManObj(p,iObj);
        if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && (int)*(uint *)pGVar2 < 0) {
          Vec_IntPush(vNodes,iObj);
        }
      }
      if (vPos != (Vec_Int_t *)0x0) {
        pGVar2 = Gia_ManObj(p,iObj);
        if ((~*(uint *)pGVar2 & 0x1fffffff) != 0 && (int)*(uint *)pGVar2 < 0) {
          Vec_IntPush(vPos,iObj);
        }
      }
      iVar4 = 1;
      iVar3 = 0;
      while( true ) {
        iVar1 = Vec_IntEntry(p->vFanoutNums,iObj);
        if (iVar1 <= iVar3) break;
        p_00 = p->vFanout;
        iVar1 = Vec_IntEntry(p_00,iObj);
        iVar1 = Vec_IntEntry(p_00,iVar1 + iVar3);
        iVar1 = Gia_ManUnivTfo_rec(p,iVar1,vNodes,vPos);
        iVar4 = iVar4 + iVar1;
        iVar3 = iVar3 + 1;
      }
    }
    return iVar4;
  }
  __assert_fail("Id < p->nTravIdsAlloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x267,"int Gia_ObjIsTravIdCurrentId(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManUnivTfo_rec( Gia_Man_t * p, int iObj, Vec_Int_t * vNodes, Vec_Int_t * vPos )
{
    int i, iFan, Count = 1;
    if ( Gia_ObjIsTravIdCurrentId(p, iObj) )
        return 0;
    Gia_ObjSetTravIdCurrentId(p, iObj);
    if ( vNodes && Gia_ObjIsCo(Gia_ManObj(p, iObj)) )
        Vec_IntPush( vNodes, iObj );    
    if ( vPos && Gia_ObjIsCo(Gia_ManObj(p, iObj)) )
        Vec_IntPush( vPos, iObj );
    Gia_ObjForEachFanoutStaticId( p, iObj, iFan, i )
        Count += Gia_ManUnivTfo_rec( p, iFan, vNodes, vPos );
    return Count;
}